

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Rotr_i32(w3Interp *this)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint32_t a;
  uint32_t *r;
  uint32_t b;
  uint32_t n;
  w3Interp *this_local;
  
  uVar1 = w3Stack::pop_u32(&this->super_w3Stack);
  puVar2 = w3Stack::u32(&this->super_w3Stack);
  *puVar2 = *puVar2 >> ((byte)uVar1 & 0x1f) | *puVar2 << (0x20 - ((byte)uVar1 & 0x1f) & 0x1f);
  return;
}

Assistant:

INTERP (Rotr_i32)
{
    const uint32_t n = 32;
    const uint32_t b = (uint32_t)(pop_u32 () & (n - 1));
    uint32_t& r = u32 ();
    uint32_t a = r;
#if _MSC_VER
    r = _rotr (a, (int)b);
#else
    r = (a >> b) | (a << (n - b));
#endif
}